

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_option_lzma.c
# Opt level: O0

void test_option_lzma(void)

{
  wchar_t wVar1;
  char *pcVar2;
  undefined4 unaff_retaddr;
  wchar_t unaff_retaddr_00;
  char *in_stack_00000008;
  char *in_stack_00000010;
  void *in_stack_00000018;
  size_t s;
  void *in_stack_00000028;
  int r;
  char *p;
  char *in_stack_00000038;
  size_t in_stack_00000050;
  char *in_stack_00000058;
  void *in_stack_00000060;
  void *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  longlong in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  wchar_t in_stack_ffffffffffffffe4;
  char *in_stack_ffffffffffffffe8;
  wchar_t in_stack_fffffffffffffff0;
  wchar_t in_stack_fffffffffffffff4;
  char *in_stack_fffffffffffffff8;
  
  assertion_make_file(in_stack_00000008,unaff_retaddr_00,in_stack_fffffffffffffff8,
                      in_stack_fffffffffffffff4,in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8)
  ;
  wVar1 = systemf("%s -cf - --lzma f >archive.out 2>archive.err",testprog);
  pcVar2 = slurpfile((size_t *)&stack0xffffffffffffffe8,"archive.err");
  pcVar2[(long)in_stack_ffffffffffffffe8] = '\0';
  if (wVar1 == L'\0') {
    slurpfile((size_t *)&stack0xffffffffffffffe8,"archive.out");
    assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                     (wchar_t)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
                     (wchar_t)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                     in_stack_ffffffffffffffc8);
    assertion_equal_mem(in_stack_00000038,p._4_4_,in_stack_00000028,(char *)s,in_stack_00000018,
                        in_stack_00000010,in_stack_00000050,in_stack_00000058,in_stack_00000060);
  }
  else {
    pcVar2 = strstr(pcVar2,"Unsupported compression");
    if (pcVar2 == (char *)0x0) {
      failure("--lzma option is broken");
      assertion_equal_int(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4,
                          in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,0,(char *)0x1130c1,
                          (void *)CONCAT44(unaff_retaddr_00,unaff_retaddr));
    }
    else {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_lzma.c"
                     ,L'-');
      test_skipping("This version of bsdtar was compiled without lzma support");
    }
  }
  return;
}

Assistant:

DEFINE_TEST(test_option_lzma)
{
	char *p;
	int r;
	size_t s;

	/* Create a file. */
	assertMakeFile("f", 0644, "a");

	/* Archive it with lzma compression. */
	r = systemf("%s -cf - --lzma f >archive.out 2>archive.err",
	    testprog);
	p = slurpfile(&s, "archive.err");
	p[s] = '\0';
	if (r != 0) {
		if (strstr(p, "Unsupported compression") != NULL) {
			skipping("This version of bsdtar was compiled "
			    "without lzma support");
			return;
		}
		failure("--lzma option is broken");
		assertEqualInt(r, 0);
		return;
	}
	/* Check that the archive file has an lzma signature. */
	p = slurpfile(&s, "archive.out");
	assert(s > 2);
	assertEqualMem(p, "\x5d\00\00", 3);
}